

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auxil.c
# Opt level: O0

c_int adapt_rho(OSQPWorkspace *work)

{
  long in_RDI;
  c_float cVar1;
  c_float rho_new;
  c_int exitflag;
  OSQPWorkspace *in_stack_00000018;
  OSQPWorkspace *in_stack_00000060;
  undefined8 local_10;
  
  local_10 = 0;
  cVar1 = compute_rho_estimate(in_stack_00000060);
  *(c_float *)(*(long *)(in_RDI + 0xd0) + 0x80) = cVar1;
  if ((**(double **)(in_RDI + 0xb8) * *(double *)(*(long *)(in_RDI + 0xb8) + 0x28) < cVar1) ||
     (cVar1 < **(double **)(in_RDI + 0xb8) / *(double *)(*(long *)(in_RDI + 0xb8) + 0x28))) {
    local_10 = osqp_update_rho(in_stack_00000018,(c_float)work);
    *(long *)(*(long *)(in_RDI + 0xd0) + 0x78) = *(long *)(*(long *)(in_RDI + 0xd0) + 0x78) + 1;
  }
  return local_10;
}

Assistant:

c_int adapt_rho(OSQPWorkspace *work) {
  c_int   exitflag; // Exitflag
  c_float rho_new;  // New rho value

  exitflag = 0;     // Initialize exitflag to 0

  // Compute new rho
  rho_new = compute_rho_estimate(work);

  // Set rho estimate in info
  work->info->rho_estimate = rho_new;

  // Check if the new rho is large or small enough and update it in case
  if ((rho_new > work->settings->rho * work->settings->adaptive_rho_tolerance) ||
      (rho_new < work->settings->rho /  work->settings->adaptive_rho_tolerance)) {
    exitflag                 = osqp_update_rho(work, rho_new);
    work->info->rho_updates += 1;
  }

  return exitflag;
}